

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O2

void test_kbest_arcs<dynet::AttentionalModel<dynet::LSTMBuilder>>
               (Model *model,AttentionalModel<dynet::LSTMBuilder> *am,string *test_file,uint top_k)

{
  __type _Var1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  uint snum;
  uint local_54c;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  items;
  int local_530;
  uint count;
  ulong local_528;
  ulong local_520;
  string id;
  Sentence target;
  Sentence source;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  last_items;
  string word;
  string last_id;
  string line;
  anon_class_40_5_ba08fbfd process;
  _Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
  local_410;
  string sep;
  istringstream in_1;
  byte abStack_398 [352];
  ifstream in;
  byte abStack_218 [488];
  
  poVar3 = std::operator<<((ostream *)&std::cerr,"Reading test examples from ");
  poVar3 = std::operator<<(poVar3,(string *)test_file);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ifstream::ifstream(&in,(string *)test_file,_S_in);
  if ((abStack_218[*(long *)(_in + -0x18)] & 5) != 0) {
    __assert_fail("in",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/attentional.cc"
                  ,0x166,
                  "void test_kbest_arcs(Model &, AM_t &, string, unsigned int) [AM_t = dynet::AttentionalModel<dynet::LSTMBuilder>]"
                 );
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  last_id._M_dataplus._M_p = (pointer)&last_id.field_2;
  line._M_string_length = 0;
  last_id._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  last_id.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&sep,"|||",(allocator *)&in_1);
  items.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  last_items.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  items.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  items.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  last_items.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  last_items.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  id._M_dataplus._M_p._4_4_ = kSRC_EOS;
  id._M_dataplus._M_p._0_4_ = kSRC_SOS;
  __l._M_len = 2;
  __l._M_array = (iterator)&id;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_410,__l,(allocator_type *)&target);
  word._M_dataplus._M_p._4_4_ = kTGT_EOS;
  word._M_dataplus._M_p._0_4_ = kTGT_SOS;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&word;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&process,__l_00,(allocator_type *)&snum);
  source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0xffffffff);
  std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>::
  tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int,_true,_true>
            ((tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
              *)&in_1,(vector<int,_std::allocator<int>_> *)&local_410,
             (vector<int,_std::allocator<int>_> *)&process,(int *)&source);
  std::
  vector<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>,std::allocator<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>>>
  ::
  emplace_back<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>>
            ((vector<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>,std::allocator<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>>>
              *)&last_items,
             (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
              *)&in_1);
  std::
  _Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  *)&in_1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&process);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_410);
  process.count = &count;
  snum = 0;
  process.snum = &snum;
  local_54c = 0;
  count = 0;
  process.items = &items;
  local_528 = (ulong)top_k;
  process.am = am;
  process.last_items = &last_items;
  do {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&in,(string *)&line);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      if (items.
          super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          items.
          super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        test_kbest_arcs<dynet::AttentionalModel<dynet::LSTMBuilder>_>::anon_class_40_5_ba08fbfd::
        operator()(&process);
      }
      std::
      vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::~vector(&last_items);
      std::
      vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::~vector(&items);
      std::__cxx11::string::~string((string *)&sep);
      std::__cxx11::string::~string((string *)&last_id);
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&in);
      return;
    }
    source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    target.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    target.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    target.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    std::__cxx11::istringstream::istringstream((istringstream *)&in_1,(string *)&line,_S_in);
    id._M_dataplus._M_p = (pointer)&id.field_2;
    word._M_dataplus._M_p = (pointer)&word.field_2;
    id._M_string_length = 0;
    word._M_string_length = 0;
    id.field_2._M_local_buf[0] = '\0';
    word.field_2._M_local_buf[0] = '\0';
    piVar4 = std::operator>>((istream *)&in_1,(string *)&id);
    std::operator>>(piVar4,(string *)&word);
    _Var1 = std::operator==(&word,&sep);
    if (!_Var1) {
      __assert_fail("word == sep",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/attentional.cc"
                    ,0x191,
                    "void test_kbest_arcs(Model &, AM_t &, string, unsigned int) [AM_t = dynet::AttentionalModel<dynet::LSTMBuilder>]"
                   );
    }
    while ((abStack_398[*(long *)(_in_1 + -0x18)] & 5) == 0) {
      std::operator>>((istream *)&in_1,(string *)&word);
      if (word._M_string_length == 0) break;
      _Var1 = std::operator==(&word,&sep);
      if (_Var1) break;
      local_410.super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
      super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
           (_Head_base<2UL,_int,_false>)dynet::Dict::convert(&sd,&word);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)
                 &source.super__Vector_base<int,_std::allocator<int>_>,(int *)&local_410);
      local_410.super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
      super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
           (_Head_base<2UL,_int,_false>)dynet::Dict::convert(&td,&word);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)
                 &target.super__Vector_base<int,_std::allocator<int>_>,(int *)&local_410);
    }
    local_520 = (ulong)local_54c;
    if (((*source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start != kSRC_SOS) &&
        (source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish[-1] != kSRC_EOS)) ||
       ((*target.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != kTGT_SOS &&
        (target.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish[-1] != kTGT_EOS)))) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Sentence in ");
      poVar3 = std::operator<<(poVar3,(string *)test_file);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," didn\'t start or end with <s>, </s>\n");
      abort();
    }
    bVar2 = std::operator!=(&id,&last_id);
    if (bVar2) {
      if (items.
          super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          items.
          super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (local_528 <
            (ulong)(((long)items.
                           super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)items.
                          super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x38)) {
          std::
          vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ::resize(&items,local_528);
        }
        test_kbest_arcs<dynet::AttentionalModel<dynet::LSTMBuilder>_>::anon_class_40_5_ba08fbfd::
        operator()(&process);
        std::
        vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
        ::operator=(&last_items,&items);
        std::__cxx11::string::_M_assign((string *)&last_id);
        std::
        vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
        ::clear(&items);
        snum = snum + 1;
        if (verbose == true) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"chug ");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = std::operator<<(poVar3," [");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::operator<<(poVar3," pairs]\r");
          std::ostream::flush();
          local_54c = local_54c + 1;
        }
      }
    }
    std::__cxx11::string::_M_assign((string *)&last_id);
    local_530 = -1;
    std::
    _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>::
    _Tuple_impl<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int,void>
              ((_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                *)&local_410,
               (vector<int,_std::allocator<int>_> *)
               &source.super__Vector_base<int,_std::allocator<int>_>,
               (vector<int,_std::allocator<int>_> *)
               &target.super__Vector_base<int,_std::allocator<int>_>,&local_530);
    std::
    vector<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>,std::allocator<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>>>
    ::
    emplace_back<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>>
              ((vector<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>,std::allocator<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>>>
                *)&items,
               (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                *)&local_410);
    std::
    _Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
    ::~_Tuple_impl(&local_410);
    std::__cxx11::string::~string((string *)&word);
    std::__cxx11::string::~string((string *)&id);
    std::__cxx11::istringstream::~istringstream((istringstream *)&in_1);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&target.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&source.super__Vector_base<int,_std::allocator<int>_>);
  } while( true );
}

Assistant:

void test_kbest_arcs(Model &model, AM_t &am, string test_file, unsigned top_k)
{
    // only suitable for monolingual setting, of predicting a sentence given preceeding sentence
    cerr << "Reading test examples from " << test_file << endl;
    unsigned lno = 0;
    ifstream in(test_file);
    assert(in);
    string line, last_id;
    const std::string sep = "|||";
    vector<SentencePair> items, last_items;
    last_items.push_back(SentencePair(Sentence({ kSRC_SOS, kSRC_EOS }), Sentence({ kTGT_SOS, kTGT_EOS }), -1));
    unsigned snum = 0;
    unsigned count = 0;

    auto process = [&am, &snum, &last_items, &items, &count]() {
        for (unsigned i = 0; i < last_items.size(); ++i) {
            ComputationGraph cg;
            auto &source = get<0>(last_items[i]);
            am.start_new_instance(source, cg);

            for (unsigned j = 0; j < items.size(); ++j) {
                std::vector<Expression> errs;
                auto &target = get<1>(items[j]);
                const unsigned tlen = target.size() - 1;
                for (unsigned t = 0; t < tlen; ++t) {
                    Expression i_r_t = am.add_input(target[t], t, cg);
                    Expression i_err = pickneglogsoftmax(i_r_t, target[t+1]);
                    errs.push_back(i_err);
                }
                Expression i_nerr = sum(errs);
                double loss = as_scalar(cg.incremental_forward(i_nerr));

                //cout << last_last_id << ":" << last_id << " |||";
                //for (auto &w: source) cout << " " << sd.convert(w);
                //cout << " |||";
                //for (auto &w: target) cout << " " << td.convert(w);
                //cout << " ||| " << loss << "\n";
                cout << snum << '\t' << i << '\t' << j << '\t' << loss << '\n';
                ++count;
            }
        }
    };

    while (getline(in, line)) {
	Sentence source, target;

	istringstream in(line);
	string id, word;
	in >> id >> word;
	assert(word == sep);
	while(in) {
	    in >> word;
	    if (word.empty() || word == sep) break;
	    source.push_back(sd.convert(word));
	    target.push_back(td.convert(word));
	}

	if ((source.front() != kSRC_SOS && source.back() != kSRC_EOS) ||
		(target.front() != kTGT_SOS && target.back() != kTGT_EOS)) {
	    cerr << "Sentence in " << test_file << ":" << lno << " didn't start or end with <s>, </s>\n";
	    abort();
	}

	if (id != last_id && !items.empty()) {
	    if (items.size() > top_k)
		items.resize(top_k);

            process();

	    last_items = items;
	    last_id = id;
	    items.clear();
            snum++;

	    if (verbose)
		cerr << "chug " << lno++ << " [" << count << " pairs]\r" << flush;
	}

	last_id = id;
	items.push_back(SentencePair(source, target, -1));
    }
    
    if (!items.empty())
        process();

    return;
}